

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

UniValue * __thiscall
RPCResult::MatchesType(UniValue *__return_storage_ptr__,RPCResult *this,UniValue *result)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  RPCResult *pRVar3;
  pointer pbVar4;
  long lVar5;
  pointer pRVar6;
  pointer pcVar7;
  string_view func;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  long lVar8;
  undefined7 uVar9;
  int iVar10;
  UniValue *pUVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  iterator iVar13;
  _Base_ptr p_Var14;
  iterator iVar15;
  NonFatalCheckError *this_00;
  undefined8 uVar16;
  char *pcVar17;
  VType t;
  ulong index;
  size_type sVar18;
  _Alloc_hider _Var19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char **in_R8;
  long lVar21;
  RPCResult *doc_entry;
  char *pcVar22;
  RPCResult *this_01;
  pointer pRVar23;
  long in_FS_OFFSET;
  string_view msg;
  string_view file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  result_obj;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doc_keys;
  UniValue match;
  UniValue errors;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  VType in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  _Alloc_hider in_stack_fffffffffffffc28;
  size_type in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  pointer in_stack_fffffffffffffc48;
  pointer in_stack_fffffffffffffc50;
  pointer in_stack_fffffffffffffc58;
  pointer in_stack_fffffffffffffc60;
  pointer in_stack_fffffffffffffc68;
  pointer in_stack_fffffffffffffc70;
  pointer in_stack_fffffffffffffc78;
  undefined1 local_378 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_340;
  vector<UniValue,_std::allocator<UniValue>_> local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  UniValue local_2f0;
  long *local_298 [2];
  long local_288 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  local_278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  VType local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  vector<UniValue,_std::allocator<UniValue>_> local_1d8;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [9];
  undefined4 local_187;
  undefined2 local_183;
  char local_181;
  VType local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<UniValue,_std::allocator<UniValue>_> local_140;
  string local_128;
  UniValue local_108;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> vStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = local_90._1_7_;
  if (this->m_skip_type_check == true) {
LAB_00378306:
    local_90[0] = 1;
    local_90._0_8_ = CONCAT71(uVar9,local_90[0]);
    UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)local_90);
  }
  else {
    t = VNULL;
    switch(this->m_type) {
    case OBJ:
    case OBJ_DYN:
      t = VOBJ;
      break;
    case ARR:
    case ARR_FIXED:
      t = VARR;
      break;
    case STR:
    case STR_HEX:
      t = VSTR;
      break;
    case NUM:
    case STR_AMOUNT:
    case NUM_TIME:
      t = VNUM;
      break;
    case BOOL:
      t = VBOOL;
      break;
    case NONE:
      break;
    case ANY:
    case ELISION:
      goto switchD_00377f3d_caseD_6;
    default:
switchD_00377f3d_default:
      this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
      local_90._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xc;
      local_90._8_8_ = "ExpectedType";
      func._M_str = "ExpectedType";
      func._M_len = 0xc;
      msg._M_str = "Unreachable code reached (non-fatal)";
      msg._M_len = 0x24;
      file._M_str = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
      ;
      file._M_len = 0x5c;
      NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x46d,func);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_003790d4;
    }
    if (t == result->typ) {
      if (t == VOBJ) {
        this_01 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pRVar3 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((this_01 != pRVar3) && (this_01->m_type == ELISION)) goto switchD_00377f3d_caseD_6;
        local_1a0 = local_190;
        local_90._8_8_ = &local_78;
        local_90._0_4_ = 1;
        local_78._M_local_buf[0] = '\0';
        local_78._M_allocated_capacity._1_7_ = (undefined7)local_190._1_8_;
        local_78._M_local_buf[8] = SUB81(local_190._1_8_,7);
        local_78._9_4_ = local_187;
        local_78._13_2_ = local_183;
        local_78._M_local_buf[0xf] = local_181;
        local_90._16_8_ = 0;
        local_198 = 0;
        local_190[0] = 0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (this->m_type == OBJ_DYN) {
          if (this_01 == pRVar3) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar16 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,0,0);
              UniValue::~UniValue((UniValue *)local_90);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar16);
              }
            }
            goto LAB_003790d4;
          }
          lVar8 = (long)&local_108.val.field_2;
          lVar21 = 8;
          for (index = 0; pUVar11 = UniValue::get_obj(result),
              index < (ulong)(((long)(pUVar11->values).
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)(pUVar11->values).
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
              index = index + 1) {
            pUVar11 = UniValue::get_obj(result);
            pUVar11 = UniValue::operator[](pUVar11,index);
            MatchesType(&local_108,this_01,pUVar11);
            if ((local_108.typ != VBOOL) ||
               (iVar10 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&local_108 + 8),"1"), iVar10 != 0)) {
              pvVar12 = UniValue::getKeys_abi_cxx11_(result);
              pbVar4 = (pvVar12->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_1c0[0] = local_1b0;
              lVar5 = *(long *)((long)pbVar4 + lVar21 + -8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1c0,lVar5,
                         *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar21) + lVar5);
              local_218 = local_108.typ;
              local_210 = &local_200;
              if (local_108.val._M_dataplus._M_p == (pointer)lVar8) {
                local_200._8_8_ = local_108.val.field_2._8_8_;
              }
              else {
                local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_108.val._M_dataplus._M_p;
              }
              local_200._M_allocated_capacity._1_7_ =
                   local_108.val.field_2._M_allocated_capacity._1_7_;
              local_200._M_local_buf[0] = local_108.val.field_2._M_local_buf[0];
              local_208 = local_108.val._M_string_length;
              local_108.val._M_string_length = 0;
              local_108.val.field_2._M_local_buf[0] = '\0';
              local_1f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_108.keys.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_108.keys.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_1f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_108.keys.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_108.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_108.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_108.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_1d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_1d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              key_00._M_string_length = in_stack_fffffffffffffc10;
              key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
              key_00.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
              key_00.field_2._8_4_ = in_stack_fffffffffffffc20;
              key_00.field_2._12_4_ = in_stack_fffffffffffffc24;
              val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc30;
              val_00._0_8_ = in_stack_fffffffffffffc28._M_p;
              val_00.val._M_string_length = in_stack_fffffffffffffc38;
              val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffc40;
              val_00.val.field_2._8_8_ = in_stack_fffffffffffffc48;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffc50;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffc58;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)in_stack_fffffffffffffc60;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = in_stack_fffffffffffffc68;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = in_stack_fffffffffffffc70;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc78;
              local_108.val._M_dataplus._M_p = (pointer)lVar8;
              UniValue::pushKV((UniValue *)local_90,key_00,val_00);
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1d8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_1f0);
              if (local_210 != &local_200) {
                operator_delete(local_210,local_200._M_allocated_capacity + 1);
              }
              if (local_1c0[0] != local_1b0) {
                operator_delete(local_1c0[0],local_1b0[0] + 1);
              }
            }
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_108.values);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_108.keys);
            if (local_108.val._M_dataplus._M_p != (pointer)lVar8) {
              operator_delete(local_108.val._M_dataplus._M_p,
                              CONCAT71(local_108.val.field_2._M_allocated_capacity._1_7_,
                                       local_108.val.field_2._M_local_buf[0]) + 1);
            }
            lVar21 = lVar21 + 0x20;
          }
          if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_108.typ._0_1_ = 1;
            UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)&local_108);
          }
          else {
            __return_storage_ptr__->typ = local_90._0_4_;
            paVar20 = &(__return_storage_ptr__->val).field_2;
            (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)paVar20;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._8_8_ == &local_78) {
              paVar20->_M_allocated_capacity =
                   CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
              *(ulong *)((long)&(__return_storage_ptr__->val).field_2 + 8) =
                   CONCAT17(local_78._M_local_buf[0xf],
                            CONCAT25(local_78._13_2_,
                                     CONCAT41(local_78._9_4_,local_78._M_local_buf[8])));
            }
            else {
              (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)local_90._8_8_;
              (__return_storage_ptr__->val).field_2._M_allocated_capacity =
                   CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
            }
            (__return_storage_ptr__->val)._M_string_length = local_90._16_8_;
            local_90._16_8_ = 0;
            local_78._M_local_buf[0] = '\0';
            (__return_storage_ptr__->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (__return_storage_ptr__->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_90._8_8_ = &local_78;
          }
        }
        else {
          p_Var1 = &local_248._M_impl.super__Rb_tree_header;
          local_248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_248._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_248._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_248._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          if (this_01 != pRVar3) {
            do {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_248,&this_01->m_key_name);
              this_01 = this_01 + 1;
            } while (this_01 != pRVar3);
          }
          p_Var2 = &local_278._M_impl.super__Rb_tree_header;
          local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_278._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
          local_278._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
          UniValue::getObjMap(result,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                      *)&local_278);
          if ((_Rb_tree_header *)local_278._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2
             ) {
            p_Var14 = local_278._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_248,(key_type *)(p_Var14 + 1));
              if ((_Rb_tree_header *)iVar13._M_node == p_Var1) {
                local_298[0] = local_288;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_298,*(long *)(p_Var14 + 1),
                           (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
                UniValue::UniValue<const_char_(&)[33],_char[33],_true>
                          (&local_2f0,(char (*) [33])"key returned that was not in doc");
                key_01._M_string_length = in_stack_fffffffffffffc10;
                key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
                key_01.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
                key_01.field_2._8_4_ = in_stack_fffffffffffffc20;
                key_01.field_2._12_4_ = in_stack_fffffffffffffc24;
                val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc30;
                val_01._0_8_ = in_stack_fffffffffffffc28._M_p;
                val_01.val._M_string_length = in_stack_fffffffffffffc38;
                val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffffc40;
                val_01.val.field_2._8_8_ = in_stack_fffffffffffffc48;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffc50;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffc58;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)in_stack_fffffffffffffc60;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = in_stack_fffffffffffffc68;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = in_stack_fffffffffffffc70;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc78;
                UniValue::pushKV((UniValue *)local_90,key_01,val_01);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2f0.values);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2f0.keys);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0.val._M_dataplus._M_p != &local_2f0.val.field_2) {
                  operator_delete(local_2f0.val._M_dataplus._M_p,
                                  local_2f0.val.field_2._M_allocated_capacity + 1);
                }
                if (local_298[0] != local_288) {
                  operator_delete(local_298[0],local_288[0] + 1);
                }
              }
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14);
            } while ((_Rb_tree_header *)p_Var14 != &local_278._M_impl.super__Rb_tree_header);
          }
          pRVar23 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar6 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          if (pRVar23 != pRVar6) {
            lVar8 = (long)&local_108.val.field_2;
            do {
              iVar15 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                       ::find(&local_278,&pRVar23->m_key_name);
              if ((_Rb_tree_header *)iVar15._M_node == &local_278._M_impl.super__Rb_tree_header) {
                if (pRVar23->m_optional == false) {
                  local_310[0] = &local_300;
                  pcVar7 = (pRVar23->m_key_name)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_310,pcVar7,
                             pcVar7 + (pRVar23->m_key_name)._M_string_length);
                  UniValue::UniValue<const_char_(&)[47],_char[47],_true>
                            ((UniValue *)(local_378 + 0x10),
                             (char (*) [47])"key missing, despite not being optional in doc");
                  key_02._M_string_length = in_stack_fffffffffffffc10;
                  key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
                  key_02.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
                  key_02.field_2._8_4_ = in_stack_fffffffffffffc20;
                  key_02.field_2._12_4_ = in_stack_fffffffffffffc24;
                  val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc30;
                  val_02._0_8_ = in_stack_fffffffffffffc28._M_p;
                  val_02.val._M_string_length = in_stack_fffffffffffffc38;
                  val_02.val.field_2._M_allocated_capacity = in_stack_fffffffffffffc40;
                  val_02.val.field_2._8_8_ = in_stack_fffffffffffffc48;
                  val_02.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffc50;
                  val_02.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffc58;
                  val_02.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)in_stack_fffffffffffffc60;
                  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start = in_stack_fffffffffffffc68;
                  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish = in_stack_fffffffffffffc70;
                  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc78;
                  UniValue::pushKV((UniValue *)local_90,key_02,val_02);
                  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_328);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_340);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._M_allocated_capacity != &local_350) {
                    operator_delete((void *)local_360._M_allocated_capacity,
                                    (ulong)(local_350._M_allocated_capacity + 1));
                  }
                  uVar16 = local_300._M_allocated_capacity;
                  _Var19._M_p = (pointer)local_310[0];
                  if (local_310[0] != &local_300) goto LAB_00378a98;
                }
              }
              else {
                MatchesType(&local_108,pRVar23,(UniValue *)(iVar15._M_node + 2));
                uVar16 = in_stack_fffffffffffffc40;
                if ((local_108.typ != VBOOL) ||
                   (iVar10 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&local_108 + 8),"1"),
                   uVar16 = in_stack_fffffffffffffc40, iVar10 != 0)) {
                  in_stack_fffffffffffffc78 = (pointer)local_378;
                  pcVar7 = (pRVar23->m_key_name)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&stack0xfffffffffffffc78,pcVar7,
                             pcVar7 + (pRVar23->m_key_name)._M_string_length);
                  in_stack_fffffffffffffc70 =
                       local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                  in_stack_fffffffffffffc68 =
                       local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  in_stack_fffffffffffffc60 =
                       local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  in_stack_fffffffffffffc58 =
                       local_108.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  in_stack_fffffffffffffc50 =
                       local_108.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  in_stack_fffffffffffffc48 =
                       local_108.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  in_stack_fffffffffffffc30 = local_108.val._M_string_length;
                  in_stack_fffffffffffffc28._M_p = &stack0xfffffffffffffc38;
                  in_stack_fffffffffffffc40 = local_108.val.field_2._8_8_;
                  if (local_108.val._M_dataplus._M_p != (pointer)lVar8) {
                    in_stack_fffffffffffffc28._M_p = local_108.val._M_dataplus._M_p;
                    in_stack_fffffffffffffc40 = uVar16;
                  }
                  in_stack_fffffffffffffc38._1_7_ =
                       local_108.val.field_2._M_allocated_capacity._1_7_;
                  in_stack_fffffffffffffc38._0_1_ = local_108.val.field_2._M_local_buf[0];
                  local_108.val._M_string_length = 0;
                  local_108.val.field_2._M_local_buf[0] = '\0';
                  local_108.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_108.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_108.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  key_03._M_string_length = in_stack_fffffffffffffc10;
                  key_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
                  key_03.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
                  key_03.field_2._8_4_ = local_108.typ;
                  key_03.field_2._12_4_ = in_stack_fffffffffffffc24;
                  val_03.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc30;
                  val_03._0_8_ = in_stack_fffffffffffffc28._M_p;
                  val_03.val._M_string_length = in_stack_fffffffffffffc38;
                  val_03.val.field_2._M_allocated_capacity = in_stack_fffffffffffffc40;
                  val_03.val.field_2._8_8_ = in_stack_fffffffffffffc48;
                  val_03.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffc50;
                  val_03.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffc58;
                  val_03.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)in_stack_fffffffffffffc60;
                  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start = in_stack_fffffffffffffc68;
                  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish = in_stack_fffffffffffffc70;
                  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc78;
                  in_stack_fffffffffffffc20 = local_108.typ;
                  local_108.val._M_dataplus._M_p = (pointer)lVar8;
                  UniValue::pushKV((UniValue *)local_90,key_03,val_03);
                  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffc60
                            );
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&stack0xfffffffffffffc48);
                  if (in_stack_fffffffffffffc28._M_p != &stack0xfffffffffffffc38) {
                    operator_delete(in_stack_fffffffffffffc28._M_p,in_stack_fffffffffffffc38 + 1);
                  }
                  if (in_stack_fffffffffffffc78 != (pointer)local_378) {
                    operator_delete(in_stack_fffffffffffffc78,local_378._0_8_ + 1);
                  }
                }
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_108.values);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_108.keys);
                if (local_108.val._M_dataplus._M_p != (pointer)lVar8) {
                  uVar16 = CONCAT71(local_108.val.field_2._M_allocated_capacity._1_7_,
                                    local_108.val.field_2._M_local_buf[0]);
                  _Var19._M_p = local_108.val._M_dataplus._M_p;
LAB_00378a98:
                  operator_delete(_Var19._M_p,uVar16 + 1);
                }
              }
              pRVar23 = pRVar23 + 1;
            } while (pRVar23 != pRVar6);
          }
          if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_108.typ._0_1_ = 1;
            UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)&local_108);
          }
          else {
            __return_storage_ptr__->typ = local_90._0_4_;
            paVar20 = &(__return_storage_ptr__->val).field_2;
            (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)paVar20;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._8_8_ == &local_78) {
              paVar20->_M_allocated_capacity =
                   CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
              *(ulong *)((long)&(__return_storage_ptr__->val).field_2 + 8) =
                   CONCAT17(local_78._M_local_buf[0xf],
                            CONCAT25(local_78._13_2_,
                                     CONCAT41(local_78._9_4_,local_78._M_local_buf[8])));
            }
            else {
              (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)local_90._8_8_;
              (__return_storage_ptr__->val).field_2._M_allocated_capacity =
                   CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
            }
            (__return_storage_ptr__->val)._M_string_length = local_90._16_8_;
            local_90._16_8_ = 0;
            local_78._M_local_buf[0] = '\0';
            (__return_storage_ptr__->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (__return_storage_ptr__->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_90._8_8_ = &local_78;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
          ::~_Rb_tree(&local_278);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_248);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._8_8_ != &local_78) goto LAB_00378d61;
      }
      else {
        if (t != VARR) {
switchD_00377f3d_caseD_6:
          goto LAB_00378306;
        }
        local_b0 = local_a0;
        local_90._8_8_ = &local_78;
        local_90._0_4_ = 1;
        local_78._M_local_buf[0] = '\0';
        local_78._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
        local_78._M_local_buf[8] = SUB81(local_a0._1_8_,7);
        local_78._9_4_ = local_97;
        local_78._13_2_ = local_93;
        local_78._M_local_buf[0xf] = local_91;
        local_90._16_8_ = 0;
        local_a8 = 0;
        local_a0[0] = 0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar8 = (long)&local_108.val.field_2;
        pcVar22 = (char *)0x0;
        while (local_248._M_impl._0_8_ = pcVar22, pUVar11 = UniValue::get_array(result),
              pcVar22 < (char *)(((long)(pUVar11->values).
                                        super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pUVar11->values).
                                        super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x2e8ba2e8ba2e8ba3)) {
          pRVar23 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pcVar17 = (char *)(((long)(this->m_inner).
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pRVar23 >> 3)
                            * -0xf0f0f0f0f0f0f0f);
          pcVar22 = pcVar17 + -1;
          if ((ulong)local_248._M_impl._0_8_ < pcVar17 + -1) {
            pcVar22 = (char *)local_248._M_impl._0_8_;
          }
          if (pcVar17 < pcVar22 || (long)pcVar17 - (long)pcVar22 == 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003790d4;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar22);
            goto switchD_00377f3d_default;
          }
          pUVar11 = UniValue::get_array(result);
          pUVar11 = UniValue::operator[](pUVar11,local_248._M_impl._0_8_);
          MatchesType(&local_108,pRVar23 + (long)pcVar22,pUVar11);
          if ((local_108.typ != VBOOL) ||
             (iVar10 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_108 + 8),"1"), iVar10 != 0)) {
            tinyformat::format<unsigned_long>(&local_128,"%d",(unsigned_long *)&local_248);
            local_180 = local_108.typ;
            local_178 = &local_168;
            if (local_108.val._M_dataplus._M_p == (pointer)lVar8) {
              local_168._8_8_ = local_108.val.field_2._8_8_;
            }
            else {
              local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108.val._M_dataplus._M_p;
            }
            local_168._M_allocated_capacity._1_7_ =
                 local_108.val.field_2._M_allocated_capacity._1_7_;
            local_168._M_local_buf[0] = local_108.val.field_2._M_local_buf[0];
            local_170 = local_108.val._M_string_length;
            local_108.val._M_string_length = 0;
            local_108.val.field_2._M_local_buf[0] = '\0';
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_108.keys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_108.keys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_108.keys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_108.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_108.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            key._M_string_length = in_stack_fffffffffffffc10;
            key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
            key.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
            key.field_2._8_4_ = in_stack_fffffffffffffc20;
            key.field_2._12_4_ = in_stack_fffffffffffffc24;
            val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc30;
            val._0_8_ = in_stack_fffffffffffffc28._M_p;
            val.val._M_string_length = in_stack_fffffffffffffc38;
            val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffc40;
            val.val.field_2._8_8_ = in_stack_fffffffffffffc48;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffc50;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffc58;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc60;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = in_stack_fffffffffffffc68;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = in_stack_fffffffffffffc70;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc78;
            local_108.val._M_dataplus._M_p = (pointer)lVar8;
            UniValue::pushKV((UniValue *)local_90,key,val);
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_140);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_158);
            if (local_178 != &local_168) {
              operator_delete(local_178,local_168._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_108.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_108.keys);
          if (local_108.val._M_dataplus._M_p != (pointer)lVar8) {
            operator_delete(local_108.val._M_dataplus._M_p,
                            CONCAT71(local_108.val.field_2._M_allocated_capacity._1_7_,
                                     local_108.val.field_2._M_local_buf[0]) + 1);
          }
          pcVar22 = (char *)(local_248._M_impl._0_8_ + 1);
        }
        if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_108.typ._0_1_ = 1;
          UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)&local_108);
        }
        else {
          __return_storage_ptr__->typ = local_90._0_4_;
          paVar20 = &(__return_storage_ptr__->val).field_2;
          (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)paVar20;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._8_8_ == &local_78) {
            paVar20->_M_allocated_capacity =
                 CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
            *(ulong *)((long)&(__return_storage_ptr__->val).field_2 + 8) =
                 CONCAT17(local_78._M_local_buf[0xf],
                          CONCAT25(local_78._13_2_,CONCAT41(local_78._9_4_,local_78._M_local_buf[8])
                                  ));
          }
          else {
            (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)local_90._8_8_;
            (__return_storage_ptr__->val).field_2._M_allocated_capacity =
                 CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
          }
          (__return_storage_ptr__->val)._M_string_length = local_90._16_8_;
          local_90._16_8_ = 0;
          local_78._M_local_buf[0] = '\0';
          (__return_storage_ptr__->keys).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (__return_storage_ptr__->keys).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->keys).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
          _M_impl.super__Vector_impl_data._M_start =
               vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_90._8_8_ = &local_78;
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._8_8_ != &local_78) {
LAB_00378d61:
          sVar18 = CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._8_8_;
          goto LAB_00378d69;
        }
      }
    }
    else {
      local_108._0_8_ = uvTypeName(result->typ);
      local_248._M_impl._0_8_ = uvTypeName(t);
      tinyformat::format<char_const*,char_const*>
                ((string *)local_90,(tinyformat *)"returned type is %s, but declared as %s in doc",
                 (char *)&local_108,(char **)&local_248,in_R8);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,(string *)local_90);
      sVar18 = local_90._16_8_;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_90 + 0x10)) {
LAB_00378d69:
        operator_delete(paVar20,sVar18 + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003790d4:
  __stack_chk_fail();
}

Assistant:

UniValue RPCResult::MatchesType(const UniValue& result) const
{
    if (m_skip_type_check) {
        return true;
    }

    const auto exp_type = ExpectedType(m_type);
    if (!exp_type) return true; // can be any type, so nothing to check

    if (*exp_type != result.getType()) {
        return strprintf("returned type is %s, but declared as %s in doc", uvTypeName(result.getType()), uvTypeName(*exp_type));
    }

    if (UniValue::VARR == result.getType()) {
        UniValue errors(UniValue::VOBJ);
        for (size_t i{0}; i < result.get_array().size(); ++i) {
            // If there are more results than documented, reuse the last doc_inner.
            const RPCResult& doc_inner{m_inner.at(std::min(m_inner.size() - 1, i))};
            UniValue match{doc_inner.MatchesType(result.get_array()[i])};
            if (!match.isTrue()) errors.pushKV(strprintf("%d", i), std::move(match));
        }
        if (errors.empty()) return true; // empty result array is valid
        return errors;
    }

    if (UniValue::VOBJ == result.getType()) {
        if (!m_inner.empty() && m_inner.at(0).m_type == Type::ELISION) return true;
        UniValue errors(UniValue::VOBJ);
        if (m_type == Type::OBJ_DYN) {
            const RPCResult& doc_inner{m_inner.at(0)}; // Assume all types are the same, randomly pick the first
            for (size_t i{0}; i < result.get_obj().size(); ++i) {
                UniValue match{doc_inner.MatchesType(result.get_obj()[i])};
                if (!match.isTrue()) errors.pushKV(result.getKeys()[i], std::move(match));
            }
            if (errors.empty()) return true; // empty result obj is valid
            return errors;
        }
        std::set<std::string> doc_keys;
        for (const auto& doc_entry : m_inner) {
            doc_keys.insert(doc_entry.m_key_name);
        }
        std::map<std::string, UniValue> result_obj;
        result.getObjMap(result_obj);
        for (const auto& result_entry : result_obj) {
            if (doc_keys.find(result_entry.first) == doc_keys.end()) {
                errors.pushKV(result_entry.first, "key returned that was not in doc");
            }
        }

        for (const auto& doc_entry : m_inner) {
            const auto result_it{result_obj.find(doc_entry.m_key_name)};
            if (result_it == result_obj.end()) {
                if (!doc_entry.m_optional) {
                    errors.pushKV(doc_entry.m_key_name, "key missing, despite not being optional in doc");
                }
                continue;
            }
            UniValue match{doc_entry.MatchesType(result_it->second)};
            if (!match.isTrue()) errors.pushKV(doc_entry.m_key_name, std::move(match));
        }
        if (errors.empty()) return true;
        return errors;
    }

    return true;
}